

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O0

bool __thiscall
Ptex::v2_2::PtexSeparableKernel::adjustMainToSubface(PtexSeparableKernel *this,int eid)

{
  int iVar1;
  int iVar2;
  uint in_ESI;
  PtexSeparableKernel *in_RDI;
  int resv;
  int resu;
  bool primary;
  bool local_d;
  
  if ((in_RDI->res).ulog2 == '\0') {
    upresU(in_RDI);
  }
  if ((in_RDI->res).vlog2 == '\0') {
    upresV(in_RDI);
  }
  if ('\0' < (in_RDI->res).ulog2) {
    (in_RDI->res).ulog2 = (in_RDI->res).ulog2 + -1;
  }
  if ('\0' < (in_RDI->res).vlog2) {
    (in_RDI->res).vlog2 = (in_RDI->res).vlog2 + -1;
  }
  local_d = false;
  iVar1 = Res::u(&in_RDI->res);
  iVar2 = Res::v(&in_RDI->res);
  switch(in_ESI & 3) {
  case 0:
    local_d = in_RDI->u < iVar1;
    in_RDI->v = in_RDI->v - iVar2;
    if (!local_d) {
      in_RDI->u = in_RDI->u - iVar1;
    }
    break;
  case 1:
    local_d = in_RDI->v < iVar2;
    if (!local_d) {
      in_RDI->v = in_RDI->v - iVar2;
    }
    break;
  case 2:
    local_d = iVar1 <= in_RDI->u;
    if (local_d) {
      in_RDI->u = in_RDI->u - iVar1;
    }
    break;
  case 3:
    local_d = iVar2 <= in_RDI->v;
    in_RDI->u = in_RDI->u - iVar1;
    if (local_d) {
      in_RDI->v = in_RDI->v - iVar2;
    }
  }
  return local_d;
}

Assistant:

bool adjustMainToSubface(int eid)
    {
        // to adjust the kernel for the subface, we must adjust the res down and offset the uv coords
        // however, if the res is already zero, we must upres the kernel first
        if (res.ulog2 == 0) upresU();
        if (res.vlog2 == 0) upresV();

        if (res.ulog2 > 0) res.ulog2--;
        if (res.vlog2 > 0) res.vlog2--;

        // offset uv coords and determine whether target subface is the primary one
        bool primary = 0;
        int resu = res.u(), resv = res.v();
        switch (eid&3) {
        case e_bottom:
            primary = (u < resu);
            v -= resv;
            if (!primary) u -= resu;
            break;
        case e_right:
            primary = (v < resv);
            if (!primary) v -= resv;
            break;
        case e_top:
            primary = (u >= resu);
            if (primary) u -= resu;
            break;
        case e_left:
            primary = (v >= resv);
            u -= resu;
            if (primary) v -= resv;
            break;
        }
        return primary;
    }